

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O1

void av1_lowbd_inv_txfm2d_add_idtx_ssse3(int32_t *input,uint8_t *output,int stride,TX_SIZE tx_size)

{
  ulong uVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [12];
  undefined1 auVar22 [16];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  int iVar31;
  undefined7 in_register_00000009;
  undefined1 (*pauVar32) [16];
  long lVar33;
  ulong uVar34;
  int iVar35;
  undefined1 (*pauVar36) [16];
  int iVar37;
  undefined1 (*pauVar38) [16];
  long lVar39;
  ulong *puVar40;
  ulong uVar41;
  int iVar42;
  undefined4 uVar43;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar53 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar64 [12];
  undefined4 uVar66;
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar79 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar95 [12];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar102 [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined2 local_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined2 local_58;
  undefined2 uStack_56;
  undefined2 uStack_54;
  undefined2 uStack_52;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  undefined1 auVar44 [12];
  undefined1 auVar45 [16];
  undefined1 auVar55 [16];
  undefined1 auVar54 [16];
  undefined1 auVar51 [16];
  undefined1 auVar56 [16];
  undefined1 auVar52 [16];
  undefined1 auVar57 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [12];
  undefined1 auVar69 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar80 [16];
  undefined1 auVar87 [16];
  undefined1 auVar86 [16];
  undefined1 auVar92 [16];
  undefined1 auVar82 [16];
  undefined1 auVar88 [16];
  undefined1 auVar93 [16];
  undefined1 auVar83 [16];
  undefined1 auVar89 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  
  uVar41 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_size) * 4);
  iVar4 = *(int *)((long)tx_size_wide + uVar41);
  iVar5 = *(int *)((long)tx_size_high + uVar41);
  iVar35 = 0x20;
  if (iVar4 < 0x20) {
    iVar35 = iVar4;
  }
  iVar31 = 0x20;
  if (iVar5 < 0x20) {
    iVar31 = iVar5;
  }
  iVar37 = 0;
  if (iVar4 != iVar5) {
    if (iVar5 < iVar4) {
      iVar37 = 1;
      if ((iVar5 * 2 == iVar4) || (iVar37 = 2, iVar5 << 2 == iVar4)) goto LAB_003d3c6c;
    }
    else {
      iVar37 = -1;
      if ((iVar4 * 2 == iVar5) || (iVar37 = -2, iVar4 << 2 == iVar5)) goto LAB_003d3c6c;
    }
    iVar37 = 0;
  }
LAB_003d3c6c:
  if (0 < iVar35 >> 3) {
    pcVar6 = av1_inv_txfm_shift_ls[CONCAT71(in_register_00000009,tx_size) & 0xffffffff];
    iVar4 = *(int *)((long)tx_size_wide_log2 + uVar41);
    iVar5 = *(int *)((long)tx_size_high_log2 + uVar41);
    pauVar38 = (undefined1 (*) [16])(input + 4);
    lVar33 = (long)iVar31 * 4;
    uVar41 = 0;
    auVar47 = _DAT_005678f0;
    do {
      if (0 < iVar31 >> 3) {
        local_48 = ZEXT416((uint)tx_size_high_log2[(long)iVar4 + 0x12]);
        auVar60 = pshuflw(ZEXT416((uint)tx_size_high_log2[(long)iVar5 + 0x12]),
                          ZEXT416((uint)tx_size_high_log2[(long)iVar5 + 0x12]),0);
        auVar70._0_12_ = auVar60._0_12_;
        auVar70._12_2_ = auVar60._6_2_;
        auVar70._14_2_ = 0x800;
        auVar63._12_4_ = auVar70._12_4_;
        auVar63._0_10_ = auVar60._0_10_;
        auVar63._10_2_ = 0x800;
        auVar62._10_6_ = auVar63._10_6_;
        auVar62._0_8_ = auVar60._0_8_;
        auVar62._8_2_ = auVar60._4_2_;
        auVar68._8_8_ = auVar62._8_8_;
        auVar68._0_8_ = 0x800000000000000;
        auVar61._6_10_ = auVar68._6_10_;
        auVar61._4_2_ = auVar60._2_2_;
        auVar61._0_2_ = auVar60._0_2_;
        auVar61._2_2_ = 0x800;
        uVar34 = 0;
        pauVar36 = pauVar38;
        do {
          cVar2 = *pcVar6;
          uVar43 = CONCAT22((short)((1 << (0xbU - cVar2 & 0x1f)) + 0x800),local_48._0_2_);
          auVar60._4_4_ = uVar43;
          auVar60._0_4_ = uVar43;
          auVar60._8_4_ = uVar43;
          auVar60._12_4_ = uVar43;
          auVar68 = ZEXT416(0xc - (int)cVar2);
          if ((iVar37 == -1) || (iVar37 == 1)) {
            lVar39 = 0;
            pauVar32 = pauVar36;
            do {
              auVar70 = packssdw(pauVar32[-1],*pauVar32);
              auVar70 = pmulhrsw(auVar70,auVar47);
              auVar83._0_12_ = auVar70._0_12_;
              auVar83._12_2_ = auVar70._6_2_;
              auVar83._14_2_ = 1;
              auVar82._12_4_ = auVar83._12_4_;
              auVar82._0_10_ = auVar70._0_10_;
              auVar82._10_2_ = 1;
              auVar81._10_6_ = auVar82._10_6_;
              auVar81._0_8_ = auVar70._0_8_;
              auVar81._8_2_ = auVar70._4_2_;
              auVar80._8_8_ = auVar81._8_8_;
              auVar80._0_8_ = 0x1000000000000;
              auVar79._6_10_ = auVar80._6_10_;
              auVar79._4_2_ = auVar70._2_2_;
              auVar79._0_2_ = auVar70._0_2_;
              auVar79._2_2_ = 1;
              auVar71._2_2_ = 0;
              auVar71._0_2_ = auVar70._8_2_;
              auVar71._4_2_ = auVar70._10_2_;
              auVar71._6_2_ = 0;
              auVar71._8_2_ = auVar70._12_2_;
              auVar71._10_2_ = 0;
              auVar71._12_2_ = auVar70._14_2_;
              auVar71._14_2_ = 1;
              auVar70 = pmaddwd(auVar79,auVar60);
              auVar84._0_4_ = auVar70._0_4_ >> auVar68;
              auVar84._4_4_ = auVar70._4_4_ >> auVar68;
              auVar84._8_4_ = auVar70._8_4_ >> auVar68;
              auVar84._12_4_ = auVar70._12_4_ >> auVar68;
              auVar70 = pmaddwd(auVar71,auVar60);
              auVar72._0_4_ = auVar70._0_4_ >> auVar68;
              auVar72._4_4_ = auVar70._4_4_ >> auVar68;
              auVar72._8_4_ = auVar70._8_4_ >> auVar68;
              auVar72._12_4_ = auVar70._12_4_ >> auVar68;
              auVar70 = packssdw(auVar84,auVar72);
              *(undefined1 (*) [16])((long)&local_c8 + lVar39) = auVar70;
              lVar39 = lVar39 + 0x10;
              pauVar32 = (undefined1 (*) [16])(*pauVar32 + lVar33);
            } while (lVar39 != 0x80);
          }
          else {
            lVar39 = 0;
            pauVar32 = pauVar36;
            do {
              auVar47 = packssdw(pauVar32[-1],*pauVar32);
              auVar89._0_12_ = auVar47._0_12_;
              auVar89._12_2_ = auVar47._6_2_;
              auVar89._14_2_ = 1;
              auVar88._12_4_ = auVar89._12_4_;
              auVar88._0_10_ = auVar47._0_10_;
              auVar88._10_2_ = 1;
              auVar87._10_6_ = auVar88._10_6_;
              auVar87._0_8_ = auVar47._0_8_;
              auVar87._8_2_ = auVar47._4_2_;
              auVar86._8_8_ = auVar87._8_8_;
              auVar86._0_8_ = 0x1000000000000;
              auVar85._6_10_ = auVar86._6_10_;
              auVar85._4_2_ = auVar47._2_2_;
              auVar85._0_2_ = auVar47._0_2_;
              auVar85._2_2_ = 1;
              auVar73._2_2_ = 0;
              auVar73._0_2_ = auVar47._8_2_;
              auVar73._4_2_ = auVar47._10_2_;
              auVar73._6_2_ = 0;
              auVar73._8_2_ = auVar47._12_2_;
              auVar73._10_2_ = 0;
              auVar73._12_2_ = auVar47._14_2_;
              auVar73._14_2_ = 1;
              auVar47 = pmaddwd(auVar85,auVar60);
              auVar90._0_4_ = auVar47._0_4_ >> auVar68;
              auVar90._4_4_ = auVar47._4_4_ >> auVar68;
              auVar90._8_4_ = auVar47._8_4_ >> auVar68;
              auVar90._12_4_ = auVar47._12_4_ >> auVar68;
              auVar47 = pmaddwd(auVar73,auVar60);
              auVar74._0_4_ = auVar47._0_4_ >> auVar68;
              auVar74._4_4_ = auVar47._4_4_ >> auVar68;
              auVar74._8_4_ = auVar47._8_4_ >> auVar68;
              auVar74._12_4_ = auVar47._12_4_ >> auVar68;
              auVar47 = packssdw(auVar90,auVar74);
              *(undefined1 (*) [16])((long)&local_c8 + lVar39) = auVar47;
              lVar39 = lVar39 + 0x10;
              pauVar32 = (undefined1 (*) [16])(*pauVar32 + lVar33);
            } while (lVar39 != 0x80);
          }
          auVar47._8_8_ = uStack_c0;
          auVar47._0_8_ = local_c8;
          auVar21._8_4_ = uStack_a0;
          auVar21._0_8_ = CONCAT44(uStack_a4,local_a8);
          auVar78._0_12_ = auVar47._0_12_;
          auVar78._12_2_ = (short)((ulong)local_c8 >> 0x30);
          auVar78._14_2_ = local_b8._6_2_;
          auVar77._12_4_ = auVar78._12_4_;
          auVar77._0_10_ = auVar47._0_10_;
          auVar77._10_2_ = local_b8._4_2_;
          auVar76._10_6_ = auVar77._10_6_;
          auVar76._8_2_ = (short)((ulong)local_c8 >> 0x20);
          auVar76._0_8_ = local_c8;
          auVar24._4_8_ = auVar76._8_8_;
          auVar24._2_2_ = local_b8._2_2_;
          auVar24._0_2_ = (short)((ulong)local_c8 >> 0x10);
          auVar75._0_4_ = CONCAT22((undefined2)local_b8,(short)local_c8);
          auVar75._4_12_ = auVar24;
          auVar101._12_2_ = (short)((uint)uStack_a4 >> 0x10);
          auVar101._0_12_ = auVar21;
          auVar101._14_2_ = uStack_92;
          auVar100._12_4_ = auVar101._12_4_;
          auVar100._0_10_ = auVar21._0_10_;
          auVar100._10_2_ = uStack_94;
          auVar99._10_6_ = auVar100._10_6_;
          auVar99._8_2_ = (short)uStack_a4;
          auVar99._0_8_ = CONCAT44(uStack_a4,local_a8);
          auVar25._4_8_ = auVar99._8_8_;
          auVar25._2_2_ = uStack_96;
          auVar25._0_2_ = (short)((uint)local_a8 >> 0x10);
          auVar22._8_8_ = uStack_80;
          auVar22._0_8_ = CONCAT44(uStack_84,local_88);
          auVar94._0_12_ = auVar22._0_12_;
          auVar94._12_2_ = (short)((uint)uStack_84 >> 0x10);
          auVar94._14_2_ = local_78._6_2_;
          auVar93._12_4_ = auVar94._12_4_;
          auVar93._0_10_ = auVar22._0_10_;
          auVar93._10_2_ = local_78._4_2_;
          auVar92._10_6_ = auVar93._10_6_;
          auVar92._8_2_ = (short)uStack_84;
          auVar92._0_8_ = CONCAT44(uStack_84,local_88);
          auVar26._4_8_ = auVar92._8_8_;
          auVar26._2_2_ = local_78._2_2_;
          auVar26._0_2_ = (short)((uint)local_88 >> 0x10);
          auVar91._0_4_ = CONCAT22((undefined2)local_78,(short)local_88);
          auVar91._4_12_ = auVar26;
          auVar23._8_4_ = uStack_60;
          auVar23._0_8_ = CONCAT44(uStack_64,local_68);
          auVar52._12_2_ = (short)((uint)uStack_64 >> 0x10);
          auVar52._0_12_ = auVar23;
          auVar52._14_2_ = uStack_52;
          auVar51._12_4_ = auVar52._12_4_;
          auVar51._0_10_ = auVar23._0_10_;
          auVar51._10_2_ = uStack_54;
          auVar50._10_6_ = auVar51._10_6_;
          auVar50._8_2_ = (short)uStack_64;
          auVar50._0_8_ = CONCAT44(uStack_64,local_68);
          auVar27._4_8_ = auVar50._8_8_;
          auVar27._2_2_ = uStack_56;
          auVar27._0_2_ = (short)((uint)local_68 >> 0x10);
          local_88 = CONCAT22((undefined2)uStack_b0,(short)uStack_c0);
          auVar64._0_8_ =
               CONCAT26(uStack_b0._2_2_,CONCAT24((short)((ulong)uStack_c0 >> 0x10),local_88));
          auVar64._8_2_ = (short)((ulong)uStack_c0 >> 0x20);
          auVar64._10_2_ = uStack_b0._4_2_;
          auVar65._12_2_ = (short)((ulong)uStack_c0 >> 0x30);
          auVar65._0_12_ = auVar64;
          auVar65._14_2_ = uStack_b0._6_2_;
          uStack_84 = CONCAT22((undefined2)uStack_90,(short)uStack_a0);
          auVar95._0_8_ =
               CONCAT26(uStack_90._2_2_,CONCAT24((short)((uint)uStack_a0 >> 0x10),uStack_84));
          auVar95._8_2_ = (short)uStack_9c;
          auVar95._10_2_ = (undefined2)uStack_8c;
          auVar96._12_2_ = (short)((uint)uStack_9c >> 0x10);
          auVar96._0_12_ = auVar95;
          auVar96._14_2_ = uStack_8c._2_2_;
          uVar66 = CONCAT22((undefined2)uStack_70,(short)uStack_80);
          auVar67._0_8_ =
               CONCAT26(uStack_70._2_2_,CONCAT24((short)((ulong)uStack_80 >> 0x10),uVar66));
          auVar67._8_2_ = (short)((ulong)uStack_80 >> 0x20);
          auVar67._10_2_ = uStack_70._4_2_;
          auVar69._12_2_ = (short)((ulong)uStack_80 >> 0x30);
          auVar69._0_12_ = auVar67;
          auVar69._14_2_ = uStack_70._6_2_;
          uVar43 = CONCAT22((undefined2)uStack_50,(short)uStack_60);
          auVar44._0_8_ =
               CONCAT26(uStack_50._2_2_,CONCAT24((short)((uint)uStack_60 >> 0x10),uVar43));
          auVar44._8_2_ = (short)uStack_5c;
          auVar44._10_2_ = (undefined2)uStack_4c;
          auVar45._12_2_ = (short)((uint)uStack_5c >> 0x10);
          auVar45._0_12_ = auVar44;
          auVar45._14_2_ = uStack_4c._2_2_;
          auVar59._0_8_ = auVar75._0_8_;
          auVar59._8_4_ = auVar24._0_4_;
          auVar59._12_4_ = auVar25._0_4_;
          auVar97._0_8_ = auVar91._0_8_;
          auVar97._8_4_ = auVar26._0_4_;
          auVar97._12_4_ = auVar27._0_4_;
          auVar98._8_4_ = (int)((ulong)auVar64._0_8_ >> 0x20);
          auVar98._0_8_ = auVar64._0_8_;
          auVar98._12_4_ = (int)((ulong)auVar95._0_8_ >> 0x20);
          auVar102._8_4_ = (int)((ulong)auVar67._0_8_ >> 0x20);
          auVar102._0_8_ = auVar67._0_8_;
          auVar102._12_4_ = (int)((ulong)auVar44._0_8_ >> 0x20);
          local_c8 = CONCAT44(CONCAT22(local_98,(short)local_a8),auVar75._0_4_);
          uStack_c0 = CONCAT44(CONCAT22(local_58,(short)local_68),auVar91._0_4_);
          local_b8 = auVar59._8_8_;
          uStack_b0 = auVar97._8_8_;
          local_a8 = auVar76._8_4_;
          uStack_a4 = auVar99._8_4_;
          uStack_a0 = auVar92._8_4_;
          uStack_9c = auVar50._8_4_;
          uStack_90 = auVar77._12_4_;
          uStack_8c = auVar100._12_4_;
          uStack_80 = CONCAT44(uVar43,uVar66);
          local_78 = auVar98._8_8_;
          uStack_70 = auVar102._8_8_;
          local_68 = auVar64._8_4_;
          uStack_64 = auVar95._8_4_;
          uStack_60 = auVar67._8_4_;
          uStack_5c = auVar44._8_4_;
          uStack_50 = auVar65._12_4_;
          uStack_4c = auVar96._12_4_;
          local_48._4_4_ = auVar45._12_4_;
          local_48._0_4_ = auVar69._12_4_;
          puVar40 = (ulong *)(output + uVar34 * 8 * (long)stride + uVar41 * 8);
          bVar3 = pcVar6[1];
          iVar42 = 1 << (~bVar3 & 0x1f);
          lVar39 = 0;
          do {
            auVar47 = *(undefined1 (*) [16])((long)&local_c8 + lVar39);
            auVar57._0_12_ = auVar47._0_12_;
            auVar57._12_2_ = auVar47._6_2_;
            auVar57._14_2_ = 1;
            auVar56._12_4_ = auVar57._12_4_;
            auVar56._0_10_ = auVar47._0_10_;
            auVar56._10_2_ = 1;
            auVar55._10_6_ = auVar56._10_6_;
            auVar55._0_8_ = auVar47._0_8_;
            auVar55._8_2_ = auVar47._4_2_;
            auVar54._8_8_ = auVar55._8_8_;
            auVar54._0_8_ = 0x1000000000000;
            auVar53._6_10_ = auVar54._6_10_;
            auVar53._4_2_ = auVar47._2_2_;
            auVar53._0_2_ = auVar47._0_2_;
            auVar53._2_2_ = 1;
            auVar46._2_2_ = 0;
            auVar46._0_2_ = auVar47._8_2_;
            auVar46._4_2_ = auVar47._10_2_;
            auVar46._6_2_ = 0;
            auVar46._8_2_ = auVar47._12_2_;
            auVar46._10_2_ = 0;
            auVar46._12_2_ = auVar47._14_2_;
            auVar46._14_2_ = 1;
            auVar60 = pmaddwd(auVar53,auVar61);
            auVar47 = pmaddwd(auVar46,auVar61);
            auVar68 = ZEXT416((uint)-(int)(char)bVar3);
            auVar58._0_4_ = (auVar60._0_4_ >> 0xc) + iVar42 >> auVar68;
            auVar58._4_4_ = (auVar60._4_4_ >> 0xc) + iVar42 >> auVar68;
            auVar58._8_4_ = (auVar60._8_4_ >> 0xc) + iVar42 >> auVar68;
            auVar58._12_4_ = (auVar60._12_4_ >> 0xc) + iVar42 >> auVar68;
            auVar48._0_4_ = (auVar47._0_4_ >> 0xc) + iVar42 >> auVar68;
            auVar48._4_4_ = (auVar47._4_4_ >> 0xc) + iVar42 >> auVar68;
            auVar48._8_4_ = (auVar47._8_4_ >> 0xc) + iVar42 >> auVar68;
            auVar48._12_4_ = (auVar47._12_4_ >> 0xc) + iVar42 >> auVar68;
            auVar47 = packssdw(auVar58,auVar48);
            uVar1 = *puVar40;
            auVar15._8_6_ = 0;
            auVar15._0_8_ = uVar1;
            auVar15[0xe] = (char)(uVar1 >> 0x38);
            auVar16._8_4_ = 0;
            auVar16._0_8_ = uVar1;
            auVar16[0xc] = (char)(uVar1 >> 0x30);
            auVar16._13_2_ = auVar15._13_2_;
            auVar17._8_4_ = 0;
            auVar17._0_8_ = uVar1;
            auVar17._12_3_ = auVar16._12_3_;
            auVar18._8_2_ = 0;
            auVar18._0_8_ = uVar1;
            auVar18[10] = (char)(uVar1 >> 0x28);
            auVar18._11_4_ = auVar17._11_4_;
            auVar19._8_2_ = 0;
            auVar19._0_8_ = uVar1;
            auVar19._10_5_ = auVar18._10_5_;
            auVar20[8] = (char)(uVar1 >> 0x20);
            auVar20._0_8_ = uVar1;
            auVar20._9_6_ = auVar19._9_6_;
            auVar28._7_8_ = 0;
            auVar28._0_7_ = auVar20._8_7_;
            auVar29._1_8_ = SUB158(auVar28 << 0x40,7);
            auVar29[0] = (char)(uVar1 >> 0x18);
            auVar29._9_6_ = 0;
            auVar30._1_10_ = SUB1510(auVar29 << 0x30,5);
            auVar30[0] = (char)(uVar1 >> 0x10);
            auVar30._11_4_ = 0;
            auVar49._3_12_ = SUB1512(auVar30 << 0x20,3);
            auVar49[2] = (char)(uVar1 >> 8);
            auVar49[0] = (byte)uVar1;
            auVar49[1] = 0;
            auVar49[0xf] = 0;
            auVar47 = paddsw(auVar49,auVar47);
            sVar7 = auVar47._0_2_;
            sVar8 = auVar47._2_2_;
            sVar9 = auVar47._4_2_;
            sVar10 = auVar47._6_2_;
            sVar11 = auVar47._8_2_;
            sVar12 = auVar47._10_2_;
            sVar13 = auVar47._12_2_;
            sVar14 = auVar47._14_2_;
            *puVar40 = CONCAT17((0 < sVar14) * (sVar14 < 0x100) * auVar47[0xe] - (0xff < sVar14),
                                CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar47[0xc] -
                                         (0xff < sVar13),
                                         CONCAT15((0 < sVar12) * (sVar12 < 0x100) * auVar47[10] -
                                                  (0xff < sVar12),
                                                  CONCAT14((0 < sVar11) * (sVar11 < 0x100) *
                                                           auVar47[8] - (0xff < sVar11),
                                                           CONCAT13((0 < sVar10) * (sVar10 < 0x100)
                                                                    * auVar47[6] - (0xff < sVar10),
                                                                    CONCAT12((0 < sVar9) *
                                                                             (sVar9 < 0x100) *
                                                                             auVar47[4] -
                                                                             (0xff < sVar9),
                                                                             CONCAT11((0 < sVar8) *
                                                                                      (sVar8 < 0x100
                                                                                      ) * auVar47[2]
                                                                                      - (0xff < 
                                                  sVar8),(0 < sVar7) * (sVar7 < 0x100) * auVar47[0]
                                                         - (0xff < sVar7))))))));
            puVar40 = (ulong *)((long)puVar40 + (long)stride);
            lVar39 = lVar39 + 0x10;
          } while (lVar39 != 0x80);
          uVar34 = uVar34 + 1;
          pauVar36 = pauVar36 + 2;
          auVar47 = _DAT_005678f0;
        } while (uVar34 != (uint)(iVar31 >> 3));
      }
      uVar41 = uVar41 + 1;
      pauVar38 = pauVar38 + (long)iVar31 * 2;
    } while (uVar41 != (uint)(iVar35 >> 3));
  }
  return;
}

Assistant:

void av1_lowbd_inv_txfm2d_add_idtx_ssse3(const int32_t *input, uint8_t *output,
                                         int stride, TX_SIZE tx_size) {
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int col_max = AOMMIN(32, txfm_size_col);
  const int row_max = AOMMIN(32, txfm_size_row);
  const int input_stride = row_max;
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);

  for (int i = 0; i < (col_max >> 3); ++i) {
    for (int j = 0; j < (row_max >> 3); j++) {
      __m128i buf[8];
      iidentity_row_8xn_ssse3(buf, input + j * 8 + i * 8 * input_stride,
                              row_max, shift[0], 8, txw_idx, rect_type);
      transpose_16bit_8x8(buf, buf);
      iidentity_col_8xn_ssse3(output + i * 8 + j * 8 * stride, stride, buf,
                              shift[1], 8, txh_idx);
    }
  }
}